

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O2

void __thiscall
Catch::StreamingReporterBase<Catch::CompactReporter>::testGroupEnded
          (StreamingReporterBase<Catch::CompactReporter> *this,TestGroupStats *param_1)

{
  LazyStat<Catch::GroupInfo>::reset(&this->currentGroupInfo);
  return;
}

Assistant:

void testGroupEnded(TestGroupStats const& /* _testGroupStats */) override {
            currentGroupInfo.reset();
        }